

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_faceForward_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float res;
  float fVar2;
  Vector<float,_3> res_1;
  float local_3c [6];
  undefined8 local_24;
  float local_1c;
  int local_18 [6];
  
  local_3c[0] = c->in[0].m_data[2];
  local_3c[1] = c->in[0].m_data[0];
  local_3c[2] = c->in[0].m_data[1];
  local_24 = *(undefined8 *)(c->in[1].m_data + 1);
  local_1c = c->in[1].m_data[0];
  local_3c[3] = c->in[2].m_data[3];
  local_3c[4] = c->in[2].m_data[1];
  local_3c[5] = c->in[2].m_data[2];
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_3c[lVar1 + 3] * *(float *)((long)&local_24 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (0.0 <= fVar2) {
    res_1.m_data[2] = 0.0;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    lVar1 = 0;
    do {
      res_1.m_data[lVar1] = -local_3c[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  else {
    res_1.m_data[2] = local_3c[2];
    res_1.m_data[0] = local_3c[0];
    res_1.m_data[1] = local_3c[1];
  }
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[local_18[lVar1]] = res_1.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }